

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O1

void write_bit(int value)

{
  uchar *puVar1;
  
  if (bit_mask == 0) {
    bit_mask = 0x80;
    bit_index = output_index;
    puVar1 = output_data + output_index;
    output_index = output_index + 1;
    *puVar1 = '\0';
  }
  if (0 < value) {
    output_data[bit_index] = output_data[bit_index] | (byte)bit_mask;
  }
  bit_mask = bit_mask >> 1;
  return;
}

Assistant:

void write_bit(int value) {
    if (bit_mask == 0) {
        bit_mask = 128;
        bit_index = output_index;
        write_byte(0);
    }
    if (value > 0) {
        output_data[bit_index] |= bit_mask;
    }
    bit_mask >>= 1;
}